

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O2

string * __thiscall shine::string::format_append(string *this,int8 *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  string tmp;
  va_list args;
  string local_128;
  __va_list_tag local_108;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_128.super_string._M_dataplus._M_p = (pointer)&local_128.super_string.field_2;
  local_128.super_string._M_string_length = 0;
  local_128.super_string.field_2._M_local_buf[0] = '\0';
  local_108.overflow_arg_area = &tmp.super_string._M_string_length;
  local_108.gp_offset = 0x10;
  local_108.fp_offset = 0x30;
  local_108.reg_save_area = local_e8;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  assert_size(fmt,&local_108);
  local_108.gp_offset = 0x10;
  local_108.fp_offset = 0x30;
  local_108.overflow_arg_area = &tmp.super_string._M_string_length;
  local_108.reg_save_area = local_e8;
  std::__cxx11::string::resize((ulong)&local_128);
  format(&local_128,fmt,&local_108);
  std::__cxx11::string::resize((ulong)&local_128);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::~string((string *)&local_128);
  return this;
}

Assistant:

string& format_append(const int8 *fmt, ...){
            string tmp;
            va_list args;
                    va_start(args, fmt);
            size_type size = assert_size(fmt, args);
                    va_end(args);

                    va_start(args, fmt);
            tmp.resize(size + 1);
            format(tmp, fmt, args);
                    va_end(args);
            tmp.resize(size);

            append(tmp);
            return *this;

        }